

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::PackageImportItemSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,PackageImportItemSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  size_t index_local;
  PackageImportItemSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->package).kind;
    token._2_1_ = (this->package).field_0x2;
    token.numFlags.raw = (this->package).numFlags.raw;
    token.rawLen = (this->package).rawLen;
    token.info = (this->package).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    token_00.kind = (this->doubleColon).kind;
    token_00._2_1_ = (this->doubleColon).field_0x2;
    token_00.numFlags.raw = (this->doubleColon).numFlags.raw;
    token_00.rawLen = (this->doubleColon).rawLen;
    token_00.info = (this->doubleColon).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
  }
  else if (index == 2) {
    token_01.kind = (this->item).kind;
    token_01._2_1_ = (this->item).field_0x2;
    token_01.numFlags.raw = (this->item).numFlags.raw;
    token_01.rawLen = (this->item).rawLen;
    token_01.info = (this->item).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_01);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax PackageImportItemSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return package;
        case 1: return doubleColon;
        case 2: return item;
        default: return nullptr;
    }
}